

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool SQVM::IsEqual(SQObjectPtr *o1,SQObjectPtr *o2,bool *res)

{
  float local_2c;
  float local_24;
  bool *res_local;
  SQObjectPtr *o2_local;
  SQObjectPtr *o1_local;
  
  if ((o1->super_SQObject)._type == (o2->super_SQObject)._type) {
    *res = (o1->super_SQObject)._unVal.pTable == (o2->super_SQObject)._unVal.pTable;
  }
  else if ((((o1->super_SQObject)._type & 0x4000000) == 0) ||
          (((o2->super_SQObject)._type & 0x4000000) == 0)) {
    *res = false;
  }
  else {
    if ((o1->super_SQObject)._type == OT_INTEGER) {
      local_24 = (float)(o1->super_SQObject)._unVal.nInteger;
    }
    else {
      local_24 = (o1->super_SQObject)._unVal.fFloat;
    }
    if ((o2->super_SQObject)._type == OT_INTEGER) {
      local_2c = (float)(o2->super_SQObject)._unVal.nInteger;
    }
    else {
      local_2c = (o2->super_SQObject)._unVal.fFloat;
    }
    *res = local_24 == local_2c;
  }
  return true;
}

Assistant:

bool SQVM::IsEqual(const SQObjectPtr &o1,const SQObjectPtr &o2,bool &res)
{
    if(type(o1) == type(o2)) {
        res = (_rawval(o1) == _rawval(o2));
    }
    else {
        if(sq_isnumeric(o1) && sq_isnumeric(o2)) {
            res = (tofloat(o1) == tofloat(o2));
        }
        else {
            res = false;
        }
    }
    return true;
}